

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O1

void __thiscall
S2Builder::Graph::MakeSiblingMap(Graph *this,vector<int,_std::allocator<int>_> *in_edge_ids)

{
  int iVar1;
  int iVar2;
  pointer ppVar3;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar4;
  pointer piVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  S2LogMessage local_40;
  S2LogMessage local_30;
  
  bVar10 = (this->options_).sibling_pairs_ + ~CREATE < 0xfffffffe;
  bVar11 = (this->options_).edge_type_ != UNDIRECTED;
  if (bVar11 && bVar10) {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
               ,0x51,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_30.stream_,
               "Check failed: options_.sibling_pairs() == SiblingPairs::REQUIRE || options_.sibling_pairs() == SiblingPairs::CREATE || options_.edge_type() == EdgeType::UNDIRECTED "
               ,0xa4);
    if (bVar11 && bVar10) {
LAB_001c1e45:
      abort();
    }
  }
  ppVar3 = (this->edges_->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (uint)((ulong)((long)(this->edges_->
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3) >> 3);
  if (0 < (int)uVar6) {
    uVar8 = 0;
    do {
      iVar7 = (in_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar8];
      if ((ppVar3[uVar8].first != ppVar3[iVar7].second) ||
         (ppVar3[uVar8].second != ppVar3[iVar7].first)) {
        S2LogMessage::S2LogMessage
                  (&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                   ,0x53,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_40.stream_,"Check failed: edge(e) == reverse(edge((*in_edge_ids)[e])) ",
                   0x3a);
        goto LAB_001c1e45;
      }
      uVar8 = uVar8 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar8);
  }
  if (((this->options_).edge_type_ != DIRECTED) && ((this->options_).degenerate_edges_ != DISCARD))
  {
    ppVar3 = (this->edges_->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start;
    iVar7 = (int)((ulong)((long)(this->edges_->
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3) >> 3);
    if (0 < iVar7) {
      pvVar4 = this->edges_;
      iVar9 = 0;
      do {
        iVar2 = ppVar3[iVar9].first;
        if (ppVar3[iVar9].second == iVar2) {
          iVar1 = iVar9 + 1;
          if (iVar7 <= iVar1) {
            S2LogMessage::S2LogMessage
                      (&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                       ,0x5b,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_40.stream_,"Check failed: (e + 1) < (num_edges()) ",0x26);
            goto LAB_001c1e45;
          }
          if ((pvVar4->
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
              _M_impl.super__Vector_impl_data._M_start[iVar1].first != iVar2) {
            S2LogMessage::S2LogMessage
                      (&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                       ,0x5c,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_40.stream_,"Check failed: (edge(e + 1).first) == (v) ",0x29);
            goto LAB_001c1e45;
          }
          if ((pvVar4->
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
              _M_impl.super__Vector_impl_data._M_start[iVar1].second != iVar2) {
            S2LogMessage::S2LogMessage
                      (&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                       ,0x5d,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_40.stream_,"Check failed: (edge(e + 1).second) == (v) ",0x2a);
            goto LAB_001c1e45;
          }
          if ((in_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar9] != iVar9) {
            S2LogMessage::S2LogMessage
                      (&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                       ,0x5e,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_40.stream_,"Check failed: ((*in_edge_ids)[e]) == (e) ",0x29);
            goto LAB_001c1e45;
          }
          if ((in_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar1] != iVar1) {
            S2LogMessage::S2LogMessage
                      (&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                       ,0x5f,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_40.stream_,"Check failed: ((*in_edge_ids)[e + 1]) == (e + 1) ",0x31);
            goto LAB_001c1e45;
          }
          piVar5 = (in_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar5[iVar9] = iVar1;
          piVar5[iVar1] = iVar9;
          iVar9 = iVar1;
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < iVar7);
    }
  }
  return;
}

Assistant:

void Graph::MakeSiblingMap(vector<Graph::EdgeId>* in_edge_ids) const {
  S2_DCHECK(options_.sibling_pairs() == SiblingPairs::REQUIRE ||
         options_.sibling_pairs() == SiblingPairs::CREATE ||
         options_.edge_type() == EdgeType::UNDIRECTED);
  for (EdgeId e = 0; e < num_edges(); ++e) {
    S2_DCHECK(edge(e) == reverse(edge((*in_edge_ids)[e])));
  }
  if (options_.edge_type() == EdgeType::DIRECTED) return;
  if (options_.degenerate_edges() == DegenerateEdges::DISCARD) return;

  for (EdgeId e = 0; e < num_edges(); ++e) {
    VertexId v = edge(e).first;
    if (edge(e).second == v) {
      S2_DCHECK_LT(e + 1, num_edges());
      S2_DCHECK_EQ(edge(e + 1).first, v);
      S2_DCHECK_EQ(edge(e + 1).second, v);
      S2_DCHECK_EQ((*in_edge_ids)[e], e);
      S2_DCHECK_EQ((*in_edge_ids)[e + 1], e + 1);
      (*in_edge_ids)[e] = e + 1;
      (*in_edge_ids)[e + 1] = e;
      ++e;
    }
  }
}